

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash,uchar *out32)

{
  uchar temp [32];
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  secp256k1_sha256 *in_stack_ffffffffffffffe0;
  
  secp256k1_sha256_finalize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  secp256k1_sha256_write
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  secp256k1_memclear(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  secp256k1_sha256_finalize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash, unsigned char *out32) {
    unsigned char temp[32];
    secp256k1_sha256_finalize(&hash->inner, temp);
    secp256k1_sha256_write(&hash->outer, temp, 32);
    secp256k1_memclear(temp, sizeof(temp));
    secp256k1_sha256_finalize(&hash->outer, out32);
}